

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_split.c
# Opt level: O1

REF_STATUS ref_split_edge_geometry(REF_GRID ref_grid)

{
  int *piVar1;
  uint node1;
  int iVar2;
  REF_NODE pRVar3;
  REF_ADJ pRVar4;
  REF_INT *pRVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  REF_BOOL allowed;
  REF_INT new_node;
  REF_BOOL tri_side;
  REF_EDGE ref_edge;
  REF_GLOB global;
  uint local_58;
  REF_INT local_54;
  REF_NODE local_50;
  int local_44;
  REF_EDGE local_40;
  REF_GLOB local_38;
  
  pRVar3 = ref_grid->node;
  uVar6 = ref_edge_create(&local_40,ref_grid);
  if (uVar6 == 0) {
    if (0 < local_40->n) {
      lVar8 = 0;
      local_50 = pRVar3;
      do {
        uVar6 = local_40->e2n[lVar8 * 2];
        node1 = local_40->e2n[lVar8 * 2 + 1];
        uVar7 = ref_cell_has_side(ref_grid->cell[8],uVar6,node1,(REF_BOOL *)&local_58);
        if (uVar7 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",
                 0x3b5,"ref_split_edge_geometry",(ulong)uVar7,"has side");
          return uVar7;
        }
        if (local_58 != 0) {
          uVar7 = ref_split_edge_mixed(ref_grid,uVar6,node1,(REF_BOOL *)&local_58);
          if (uVar7 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                   ,0x3b8,"ref_split_edge_geometry",(ulong)uVar7,"mixed");
            return uVar7;
          }
          if (local_58 != 0) {
            uVar7 = ref_cell_has_side(ref_grid->cell[3],uVar6,node1,&local_44);
            if (uVar7 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                     ,0x3bc,"ref_split_edge_geometry",(ulong)uVar7,"has side");
              return uVar7;
            }
            if (-1 < (int)uVar6) {
              pRVar4 = ref_grid->cell[3]->ref_adj;
              iVar2 = pRVar4->nnode;
              if (((((int)uVar6 < iVar2) && ((int)node1 < iVar2)) && (-1 < (int)node1)) &&
                 ((pRVar5 = pRVar4->first, pRVar5[uVar6] != -1 && (pRVar5[node1] != -1)))) {
                local_58 = (uint)(local_44 == 0);
                if (local_44 == 0) {
                  uVar7 = ref_cell_local_gem(ref_grid->cell[8],local_50,uVar6,node1,
                                             (REF_BOOL *)&local_58);
                  if (uVar7 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                           ,0x3c4,"ref_split_edge_geometry",(ulong)uVar7,"local tet");
                    return uVar7;
                  }
                  if (local_58 == 0) {
                    pRVar5 = local_50->age;
                    piVar1 = pRVar5 + uVar6;
                    *piVar1 = *piVar1 + 1;
                    piVar1 = pRVar5 + node1;
                    *piVar1 = *piVar1 + 1;
                  }
                  else {
                    uVar7 = ref_node_next_global(local_50,&local_38);
                    if (uVar7 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                             ,0x3cb,"ref_split_edge_geometry",(ulong)uVar7,"next global");
                      return uVar7;
                    }
                    uVar7 = ref_node_add(local_50,local_38,&local_54);
                    if (uVar7 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                             ,0x3cc,"ref_split_edge_geometry",(ulong)uVar7,"new node");
                      return uVar7;
                    }
                    uVar7 = ref_node_interpolate_edge(local_50,uVar6,node1,0.5,local_54);
                    if (uVar7 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                             ,0x3ce,"ref_split_edge_geometry",(ulong)uVar7,"interp new node");
                      return uVar7;
                    }
                    uVar7 = ref_geom_add_between(ref_grid,uVar6,node1,0.5,local_54);
                    if (uVar7 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                             ,0x3d0,"ref_split_edge_geometry",(ulong)uVar7,"geom new node");
                      return uVar7;
                    }
                    uVar7 = ref_geom_constrain(ref_grid,local_54);
                    if (uVar7 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                             ,0x3d1,"ref_split_edge_geometry",(ulong)uVar7,"geom constraint");
                      return uVar7;
                    }
                    uVar7 = ref_metric_interpolate_between(ref_grid,uVar6,node1,local_54);
                    if (uVar7 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                             ,0x3d3,"ref_split_edge_geometry",(ulong)uVar7,"interp new node metric")
                      ;
                      return uVar7;
                    }
                    uVar6 = ref_split_edge(ref_grid,uVar6,node1,local_54);
                    if (uVar6 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                             ,0x3d5,"ref_split_edge_geometry",(ulong)uVar6,"split");
                      return uVar6;
                    }
                  }
                }
                goto LAB_002140cd;
              }
            }
            local_58 = 0;
          }
        }
LAB_002140cd:
        lVar8 = lVar8 + 1;
      } while (lVar8 < local_40->n);
    }
    ref_edge_free(local_40);
    uVar6 = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x3af,
           "ref_split_edge_geometry",(ulong)uVar6,"orig edges");
  }
  return uVar6;
}

Assistant:

REF_FCN REF_STATUS ref_split_edge_geometry(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_EDGE ref_edge;
  REF_INT edge;
  REF_BOOL allowed, tri_side;
  REF_GLOB global;
  REF_INT node0, node1;
  REF_INT new_node;

  RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);
    RSS(ref_cell_has_side(ref_grid_tet(ref_grid), node0, node1, &allowed),
        "has side");
    if (!allowed) continue;

    RSS(ref_split_edge_mixed(ref_grid, node0, node1, &allowed), "mixed");
    if (!allowed) continue;

    RSS(ref_cell_has_side(ref_grid_tri(ref_grid), node0, node1, &tri_side),
        "has side");
    allowed =
        (!ref_cell_node_empty(ref_grid_tri(ref_grid), node0) &&
         !ref_cell_node_empty(ref_grid_tri(ref_grid), node1) && !tri_side);
    if (!allowed) continue;

    RSS(ref_cell_local_gem(ref_grid_tet(ref_grid), ref_node, node0, node1,
                           &allowed),
        "local tet");
    if (!allowed) {
      ref_node_age(ref_node, node0)++;
      ref_node_age(ref_node, node1)++;
      continue;
    }

    RSS(ref_node_next_global(ref_node, &global), "next global");
    RSS(ref_node_add(ref_node, global, &new_node), "new node");
    RSS(ref_node_interpolate_edge(ref_node, node0, node1, 0.5, new_node),
        "interp new node");
    RSS(ref_geom_add_between(ref_grid, node0, node1, 0.5, new_node),
        "geom new node");
    RSS(ref_geom_constrain(ref_grid, new_node), "geom constraint");
    RSS(ref_metric_interpolate_between(ref_grid, node0, node1, new_node),
        "interp new node metric");

    RSS(ref_split_edge(ref_grid, node0, node1, new_node), "split");
  }

  ref_edge_free(ref_edge);

  return REF_SUCCESS;
}